

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O1

set<double,_std::less<double>,_std::allocator<double>_> * __thiscall
CMU462::DynamicScene::Skeleton::load
          (set<double,_std::less<double>,_std::allocator<double>_> *__return_storage_ptr__,
          Skeleton *this,char *filename)

{
  _Rb_tree_header *p_Var1;
  pointer ppJVar2;
  XMLError XVar3;
  size_t sVar4;
  XMLElement *jointNode;
  Joint *pJVar5;
  XMLDocument xmlDoc;
  XMLDocument local_2a0;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Loading skeleton from file ",0x1b);
  if (filename == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x31ebc8);
  }
  else {
    sVar4 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  tinyxml2::XMLDocument::XMLDocument(&local_2a0,true,PRESERVE_WHITESPACE);
  XVar3 = tinyxml2::XMLDocument::LoadFile(&local_2a0,filename);
  if (XVar3 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar3);
  }
  if (local_2a0.super_XMLNode._firstChild == (XMLNode *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skeleton file is not a valid XML file.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  else {
    jointNode = tinyxml2::XMLNode::FirstChildElement(local_2a0.super_XMLNode._firstChild,"Joint");
    if (jointNode == (XMLElement *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Root joint does not exist.",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    else {
      ppJVar2 = (this->joints).
                super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->joints).
          super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppJVar2) {
        (this->joints).
        super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppJVar2;
      }
      pJVar5 = loadJoint(this,jointNode,__return_storage_ptr__);
      this->root = pJVar5;
      pJVar5->parent = (Joint *)0x0;
    }
  }
  tinyxml2::XMLDocument::~XMLDocument(&local_2a0);
  return __return_storage_ptr__;
}

Assistant:

set<double> Skeleton::load(const char * filename)
   {
     set<double> knotTimes;
     cerr << "Loading skeleton from file " << filename << endl;
     XMLDocument xmlDoc;
     XMLError eResult = xmlDoc.LoadFile(filename);
     XMLCheckResult(eResult);

     XMLNode* pRoot = xmlDoc.FirstChild();
     if (pRoot == nullptr)
     {
       cout << "Skeleton file is not a valid XML file." << endl;
       return knotTimes;
     }

     XMLElement * pElement = pRoot->FirstChildElement("Joint");
     if (pElement == nullptr)
     {
       cout << "Root joint does not exist." << endl;
       return knotTimes;
     }

     // clear skeleton and create a new one
     joints.clear();
     root = loadJoint(pElement, knotTimes);
     root->parent = nullptr;

     return knotTimes;
   }